

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O3

RefArrayVectorOf<char16_t> * __thiscall
xercesc_4_0::RegularExpression::tokenize
          (RegularExpression *this,char *expression,MemoryManager *manager)

{
  short *psVar1;
  XMLCh *toDelete;
  RefArrayVectorOf<char16_t> *pRVar2;
  XMLSize_t end;
  ArrayJanitor<char16_t> janBuf;
  ArrayJanitor<char16_t> AStack_28;
  
  toDelete = XMLString::transcode(expression,manager);
  ArrayJanitor<char16_t>::ArrayJanitor(&AStack_28,toDelete,manager);
  end = 0;
  if (toDelete != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)toDelete + end);
      end = end + 2;
    } while (*psVar1 != 0);
    end = ((long)end >> 1) - 1;
  }
  pRVar2 = tokenize(this,toDelete,0,end,manager);
  ArrayJanitor<char16_t>::~ArrayJanitor(&AStack_28);
  return pRVar2;
}

Assistant:

RefArrayVectorOf<XMLCh>* RegularExpression::tokenize(const char* const expression,
                                                     MemoryManager* const manager) const
{

  XMLCh* tmpBuf = XMLString::transcode(expression, manager);
  ArrayJanitor<XMLCh> janBuf(tmpBuf, manager);
  return tokenize(tmpBuf, 0, XMLString::stringLen(tmpBuf), manager);
}